

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_>::
printOptionValue(opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *this
                ,size_t GlobalWidth,bool Force)

{
  bool bVar1;
  OptionValueBase<(anonymous_namespace)::HelpPrinterWrapper,_true> *this_00;
  HelpPrinterWrapper *pHVar2;
  OptionValue<(anonymous_namespace)::HelpPrinterWrapper> *Default;
  bool Force_local;
  size_t GlobalWidth_local;
  opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *this_local;
  
  if (!Force) {
    this_00 = &opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>::getDefault
                         (&this->
                           super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>)
               ->super_OptionValueBase<(anonymous_namespace)::HelpPrinterWrapper,_true>;
    pHVar2 = opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>::getValue
                       (&this->
                         super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>);
    bVar1 = OptionValueBase<(anonymous_namespace)::HelpPrinterWrapper,_true>::compare
                      (this_00,pHVar2);
    if (!bVar1) {
      return;
    }
  }
  pHVar2 = opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>::getValue
                     (&this->
                       super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>);
  Default = opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>::getDefault
                      (&this->
                        super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>);
  printOptionDiff<llvm::cl::parser<bool>,(anonymous_namespace)::HelpPrinterWrapper>
            (&this->super_Option,&(this->Parser).super_basic_parser<bool>,pHVar2,Default,GlobalWidth
            );
  return;
}

Assistant:

void printOptionValue(size_t GlobalWidth, bool Force) const override {
    if (Force || this->getDefault().compare(this->getValue())) {
      cl::printOptionDiff<ParserClass>(*this, Parser, this->getValue(),
                                       this->getDefault(), GlobalWidth);
    }
  }